

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void * bc_realloc(void *ptr,size_t size)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t sVar5;
  
  sVar5 = size;
  pvVar2 = realloc(ptr,size);
  if (size != 0 && pvVar2 == (void *)0x0) {
    bc_realloc_cold_1();
    puVar3 = (undefined8 *)bc_malloc(0x10);
    puVar3[1] = sVar5;
    *puVar3 = 0;
    puVar1 = (undefined8 *)ptr;
    if ((undefined8 *)ptr != (undefined8 *)0x0) {
      do {
        puVar4 = puVar1;
        puVar1 = (undefined8 *)*puVar4;
      } while (puVar1 != (undefined8 *)0x0);
      *puVar4 = puVar3;
      puVar3 = (undefined8 *)ptr;
    }
    return puVar3;
  }
  return pvVar2;
}

Assistant:

void*
bc_realloc(void *ptr, size_t size)
{
    // simple things even simpler :P
    void *rv = realloc(ptr, size);
    if (rv == NULL && size != 0) {
        fprintf(stderr, "fatal: Failed to reallocate memory!\n");
        free(ptr);
        abort();
    }
    return rv;
}